

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.cpp
# Opt level: O0

int mbedtls_rsa_pkcs1_sign
              (mbedtls_rsa_context *ctx,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng,
              mbedtls_md_type_t md_alg,uint hashlen,uchar *hash,uchar *sig)

{
  int in_ECX;
  undefined8 in_RDX;
  void *in_RSI;
  _func_int_void_ptr_uchar_ptr_size_t *in_RDI;
  int in_R8D;
  long in_R9;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar1;
  
  if (((in_ECX == 0) && (in_R8D == 0)) || (in_R9 != 0)) {
    if (*(int *)(in_RDI + 0xe0) == 0) {
      iVar1 = mbedtls_rsa_rsassa_pkcs1_v15_sign
                        ((mbedtls_rsa_context *)
                         CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,in_RSI
                         ,(mbedtls_md_type_t)((ulong)in_RDX >> 0x20),(uint)in_RDX,
                         (uchar *)CONCAT44(in_ECX,in_R8D),(uchar *)CONCAT44(md_alg,hashlen));
    }
    else {
      iVar1 = -0x4100;
    }
  }
  else {
    iVar1 = -0x4080;
  }
  return iVar1;
}

Assistant:

int mbedtls_rsa_pkcs1_sign(mbedtls_rsa_context *ctx,
                           int (*f_rng)(void *, unsigned char *, size_t),
                           void *p_rng,
                           mbedtls_md_type_t md_alg,
                           unsigned int hashlen,
                           const unsigned char *hash,
                           unsigned char *sig)
{
    if ((md_alg != MBEDTLS_MD_NONE || hashlen != 0) && hash == NULL) {
        return MBEDTLS_ERR_RSA_BAD_INPUT_DATA;
    }

    switch (ctx->padding) {
#if defined(MBEDTLS_PKCS1_V15)
        case MBEDTLS_RSA_PKCS_V15:
            return mbedtls_rsa_rsassa_pkcs1_v15_sign(ctx, f_rng, p_rng,
                                                     md_alg, hashlen, hash, sig);
#endif

#if defined(MBEDTLS_PKCS1_V21)
        case MBEDTLS_RSA_PKCS_V21:
            return mbedtls_rsa_rsassa_pss_sign(ctx, f_rng, p_rng, md_alg,
                                               hashlen, hash, sig);
#endif

        default:
            return MBEDTLS_ERR_RSA_INVALID_PADDING;
    }
}